

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::createSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,TestParameters params)

{
  InstanceDriver *vki;
  ostringstream *this;
  long lVar1;
  Type wsiType;
  undefined8 *puVar2;
  VkSwapchainCreateInfoKHR *pVVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> cases;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_928;
  RefBase<vk::Handle<(vk::HandleType)26>_> local_908;
  NativeObjects native;
  VkSwapchainCreateInfoKHR curParams;
  undefined1 local_858 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848 [23];
  InstanceHelper instHelper;
  DeviceHelper devHelper;
  
  bVar6 = 0;
  wsiType = params.wsiType;
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper);
  vki = &instHelper.vki;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_928.m_data.deleter.m_instance =
       (VkInstance)devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_928.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_928.m_data.object.m_internal = (deUint64)devHelper.physicalDevice;
  local_928.m_data.deleter.m_instanceIface = (InstanceInterface *)devHelper._8_8_;
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  devHelper.queueFamilyIndex = 0;
  devHelper._12_4_ = 0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&devHelper);
  DeviceHelper::DeviceHelper
            (&devHelper,context,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_928.m_data.object.m_internal,(VkAllocationCallbacks *)0x0);
  generateSwapchainParameterCases
            (&cases,wsiType,params.dimension,&vki->super_InstanceInterface,devHelper.physicalDevice,
             (VkSurfaceKHR)local_928.m_data.object.m_internal);
  this = (ostringstream *)(local_858 + 8);
  lVar4 = 1;
  lVar5 = 0;
  while( true ) {
    if ((ulong)(((long)cases.
                       super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)cases.
                      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x68) <= lVar4 - 1U) break;
    puVar2 = (undefined8 *)
             ((long)&(cases.
                      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sType + lVar5);
    pVVar3 = &curParams;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pVVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar6 * -2 + 1;
      pVVar3 = (VkSwapchainCreateInfoKHR *)((long)pVVar3 + (ulong)bVar6 * -0x10 + 8);
    }
    curParams.surface.m_internal = local_928.m_data.object.m_internal;
    curParams.queueFamilyIndexCount = 1;
    curParams.pQueueFamilyIndices = &devHelper.queueFamilyIndex;
    local_858._0_8_ = context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Sub-case ");
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::operator<<((ostream *)this," / ");
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::operator<<((ostream *)this,": ");
    ::vk::operator<<((ostream *)this,&curParams);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_858,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)&local_908,
               &devHelper.vkd.super_DeviceInterface,
               devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,&curParams,
               (VkAllocationCallbacks *)0x0);
    local_848[0]._M_allocated_capacity = local_908.m_data.deleter.m_device;
    local_848[0]._8_8_ = local_908.m_data.deleter.m_allocator;
    local_858._0_8_ = local_908.m_data.object.m_internal;
    local_858._8_8_ = local_908.m_data.deleter.m_deviceIface;
    local_908.m_data.object.m_internal = 0;
    local_908.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_908.m_data.deleter.m_device = (VkDevice)0x0;
    local_908.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase(&local_908);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)26>_> *)local_858);
    lVar5 = lVar5 + 0x68;
    lVar4 = lVar4 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_858,"Creating swapchain succeeded",(allocator<char> *)&curParams);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_858);
  std::__cxx11::string::~string((string *)local_858);
  std::_Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
  ~_Vector_base(&cases.
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               );
  DeviceHelper::~DeviceHelper(&devHelper);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_928);
  NativeObjects::~NativeObjects(&native);
  InstanceHelper::~InstanceHelper(&instHelper);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSwapchainTest (Context& context, TestParameters params)
{
	const InstanceHelper					instHelper	(context, params.wsiType);
	const NativeObjects						native		(context, instHelper.supportedExtensions, params.wsiType);
	const Unique<VkSurfaceKHR>				surface		(createSurface(instHelper.vki, *instHelper.instance, params.wsiType, *native.display, *native.window));
	const DeviceHelper						devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const vector<VkSwapchainCreateInfoKHR>	cases		(generateSwapchainParameterCases(params.wsiType, params.dimension, instHelper.vki, devHelper.physicalDevice, *surface));

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		VkSwapchainCreateInfoKHR	curParams	= cases[caseNdx];

		curParams.surface				= *surface;
		curParams.queueFamilyIndexCount	= 1u;
		curParams.pQueueFamilyIndices	= &devHelper.queueFamilyIndex;

		context.getTestContext().getLog()
			<< TestLog::Message << "Sub-case " << (caseNdx+1) << " / " << cases.size() << ": " << curParams << TestLog::EndMessage;

		{
			const Unique<VkSwapchainKHR>	swapchain	(createSwapchainKHR(devHelper.vkd, *devHelper.device, &curParams));
		}
	}

	return tcu::TestStatus::pass("Creating swapchain succeeded");
}